

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O0

ProKey * __thiscall ProFile::getHashStr(ProFile *this,ushort **tPtr)

{
  ushort uVar1;
  ushort *puVar2;
  long *in_RDX;
  ProFile *in_RSI;
  ProKey *in_RDI;
  uint len;
  uint hash;
  ProKey *ret;
  uint in_stack_ffffffffffffffac;
  ProKey *this_00;
  
  *in_RDX = *in_RDX + 2;
  *in_RDX = *in_RDX + 2;
  puVar2 = (ushort *)*in_RDX;
  *in_RDX = (long)(puVar2 + 1);
  uVar1 = *puVar2;
  this_00 = in_RDI;
  memset(in_RDI,0xaa,0x30);
  items(in_RSI);
  tokPtr((ProFile *)0x11353a);
  ProKey::ProKey(this_00,(QString *)in_RSI,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                 in_stack_ffffffffffffffac);
  *in_RDX = *in_RDX + (ulong)uVar1 * 2;
  return in_RDI;
}

Assistant:

ProKey ProFile::getHashStr(const ushort *&tPtr)
{
    uint hash = *tPtr++;
    hash |= (uint)*tPtr++ << 16;
    uint len = *tPtr++;
    ProKey ret(items(), tPtr - tokPtr(), len, hash);
    tPtr += len;
    return ret;
}